

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

hashelement_t * install(char *b,char *l,char *r,char *wp,hashelement_t **hashtable)

{
  uint uVar1;
  char *pcVar2;
  hashelement_t *phStack_40;
  uint hashval;
  hashelement_t *np;
  hashelement_t **hashtable_local;
  char *wp_local;
  char *r_local;
  char *l_local;
  char *b_local;
  
  phStack_40 = lookup(b,l,r,wp,hashtable);
  if (phStack_40 == (hashelement_t *)0x0) {
    phStack_40 = (hashelement_t *)calloc(1,0x30);
    if (phStack_40 != (hashelement_t *)0x0) {
      pcVar2 = strdup(b);
      phStack_40->basephone = pcVar2;
      if (pcVar2 != (char *)0x0) {
        pcVar2 = strdup(l);
        phStack_40->leftcontext = pcVar2;
        if (pcVar2 != (char *)0x0) {
          pcVar2 = strdup(r);
          phStack_40->rightcontext = pcVar2;
          if (pcVar2 != (char *)0x0) {
            pcVar2 = strdup(wp);
            phStack_40->wordposition = pcVar2;
            if (pcVar2 != (char *)0x0) {
              phStack_40->dictcount = 0;
              phStack_40->count = 0;
              uVar1 = hash(b,l,r,wp);
              phStack_40->next = hashtable[uVar1];
              hashtable[uVar1] = phStack_40;
              goto LAB_00102712;
            }
          }
        }
      }
    }
    b_local = (char *)0x0;
  }
  else {
LAB_00102712:
    b_local = (char *)phStack_40;
  }
  return (hashelement_t *)b_local;
}

Assistant:

hashelement_t *install(const char *b, const char *l, const char *r, const char *wp, 
			hashelement_t **hashtable)
{
    hashelement_t  *np;
    unsigned hashval;

    if ((np = lookup(b, l, r, wp, hashtable)) == NULL)
    {
        np = (hashelement_t *) calloc (1,sizeof(*np));
        if (np == NULL || 
	    (np->basephone = strdup(b)) == NULL || 
	    (np->leftcontext = strdup(l)) == NULL ||
	    (np->rightcontext = strdup(r)) == NULL ||
	    (np->wordposition = strdup(wp)) == NULL)
            return NULL;

        np->dictcount = 0;
	np->count = 0;
        hashval = hash(b,l,r,wp);
        np->next = hashtable[hashval];
        hashtable[hashval] = np;
    }
    return np;
}